

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadLght_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Light *this_00;
  __shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *msh_00;
  LineSplitter *splitter_00;
  Logger *pLVar4;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar5;
  basic_formatter *pbVar6;
  ai_real aVar7;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  string local_570;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  string local_3d8;
  char *local_3b8;
  char *rgb;
  string local_238;
  string local_218;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_80;
  element_type *local_60;
  Light *msh;
  shared_ptr<Assimp::COB::Light> local_48;
  shared_ptr<Assimp::COB::Node> local_38;
  ChunkInfo *local_28;
  ChunkInfo *nfo_local;
  LineSplitter *splitter_local;
  Scene *out_local;
  COBImporter *this_local;
  
  local_28 = nfo;
  nfo_local = (ChunkInfo *)splitter;
  splitter_local = (LineSplitter *)out;
  out_local = (Scene *)this;
  if (nfo->version < 9) {
    this_00 = (Light *)operator_new(0xf0);
    COB::Light::Light(this_00);
    std::shared_ptr<Assimp::COB::Light>::shared_ptr<Assimp::COB::Light,void>(&local_48,this_00);
    std::shared_ptr<Assimp::COB::Node>::shared_ptr<Assimp::COB::Light,void>(&local_38,&local_48);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::push_back(&out->nodes,&local_38);
    std::shared_ptr<Assimp::COB::Node>::~shared_ptr(&local_38);
    std::shared_ptr<Assimp::COB::Light>::~shared_ptr(&local_48);
    this_01 = &std::
               deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ::back((deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                       *)splitter_local)->
               super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>;
    msh_00 = std::__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
    uVar1 = local_28->parent_id;
    (msh_00->super_ChunkInfo).id = local_28->id;
    (msh_00->super_ChunkInfo).parent_id = uVar1;
    uVar1 = local_28->size;
    (msh_00->super_ChunkInfo).version = local_28->version;
    (msh_00->super_ChunkInfo).size = uVar1;
    local_60 = msh_00;
    splitter_00 = LineSplitter::operator++((LineSplitter *)nfo_local);
    ReadBasicNodeInfo_Ascii(this,msh_00,splitter_00,local_28);
    bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"Infinite ");
    if (bVar2) {
      local_60[1].super_ChunkInfo.version = 2;
    }
    else {
      bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"Local ");
      if (bVar2) {
        local_60[1].super_ChunkInfo.version = 1;
      }
      else {
        bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"Spot ");
        if (bVar2) {
          local_60[1].super_ChunkInfo.version = 0;
        }
        else {
          pLVar4 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[46]>
                    (&local_1f8,(char (*) [46])"Unknown kind of light source in `Lght` chunk ");
          pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_1f8,&local_28->id);
          pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar5,(char (*) [4])0xb5fb4f);
          LineSplitter::operator*[abi_cxx11_(&local_218,(LineSplitter *)nfo_local);
          pbVar6 = (basic_formatter *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar5,&local_218);
          Formatter::basic_formatter::operator_cast_to_string(&local_80,pbVar6);
          Logger::warn(pLVar4,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_218);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_1f8);
          local_60[1].super_ChunkInfo.version = 0;
        }
      }
    }
    LineSplitter::operator++((LineSplitter *)nfo_local);
    bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"color ");
    if (!bVar2) {
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[39]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&rgb,
                 (char (*) [39])"Expected `color` line in `Lght` chunk ");
      pbVar6 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&rgb,
                         &local_28->id);
      Formatter::basic_formatter::operator_cast_to_string(&local_238,pbVar6);
      Logger::warn(pLVar4,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&rgb)
      ;
    }
    local_3b8 = LineSplitter::operator[]((LineSplitter *)nfo_local,1);
    ReadFloat3Tuple_Ascii<aiColor3D>(this,(aiColor3D *)&local_60->field_0xd4,&local_3b8);
    SkipSpaces<char>(&local_3b8);
    iVar3 = strncmp(local_3b8,"cone angle",10);
    if (iVar3 != 0) {
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[62]>
                (&local_550,
                 (char (*) [62])"Expected `cone angle` entity in `color` line in `Lght` chunk ");
      pbVar6 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_550,&local_28->id);
      Formatter::basic_formatter::operator_cast_to_string(&local_3d8,pbVar6);
      Logger::warn(pLVar4,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_550);
    }
    SkipSpaces<char>(local_3b8 + 10,&local_3b8);
    aVar7 = fast_atof(&local_3b8);
    local_60[1].super_ChunkInfo.id = (uint)aVar7;
    SkipSpaces<char>(&local_3b8);
    iVar3 = strncmp(local_3b8,"inner angle",0xb);
    if (iVar3 != 0) {
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[63]>
                (&local_6e8,
                 (char (*) [63])"Expected `inner angle` entity in `color` line in `Lght` chunk ");
      pbVar6 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_6e8,&local_28->id);
      Formatter::basic_formatter::operator_cast_to_string(&local_570,pbVar6);
      Logger::warn(pLVar4,&local_570);
      std::__cxx11::string::~string((string *)&local_570);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_6e8);
    }
    SkipSpaces<char>(local_3b8 + 0xb,&local_3b8);
    aVar7 = fast_atof(&local_3b8);
    local_60[1].super_ChunkInfo.parent_id = (uint)aVar7;
  }
  else {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Lght");
  }
  return;
}

Assistant:

void COBImporter::ReadLght_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Lght");
    }

    out.nodes.push_back(std::shared_ptr<Light>(new Light()));
    Light& msh = (Light&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Ascii(msh,++splitter,nfo);

    if (splitter.match_start("Infinite ")) {
        msh.ltype = Light::INFINITE;
    }
    else if (splitter.match_start("Local ")) {
        msh.ltype = Light::LOCAL;
    }
    else if (splitter.match_start("Spot ")) {
        msh.ltype = Light::SPOT;
    }
    else {
        ASSIMP_LOG_WARN_F( "Unknown kind of light source in `Lght` chunk ", nfo.id, " : ", *splitter );
        msh.ltype = Light::SPOT;
    }

    ++splitter;
    if (!splitter.match_start("color ")) {
        ASSIMP_LOG_WARN_F( "Expected `color` line in `Lght` chunk ", nfo.id );
    }

    const char* rgb = splitter[1];
    ReadFloat3Tuple_Ascii(msh.color ,&rgb);

    SkipSpaces(&rgb);
    if (strncmp(rgb,"cone angle",10) != 0) {
        ASSIMP_LOG_WARN_F( "Expected `cone angle` entity in `color` line in `Lght` chunk ", nfo.id );
    }
    SkipSpaces(rgb+10,&rgb);
    msh.angle = fast_atof(&rgb);

    SkipSpaces(&rgb);
    if (strncmp(rgb,"inner angle",11) != 0) {
        ASSIMP_LOG_WARN_F( "Expected `inner angle` entity in `color` line in `Lght` chunk ", nfo.id);
    }
    SkipSpaces(rgb+11,&rgb);
    msh.inner_angle = fast_atof(&rgb);

    // skip the rest for we can't handle this kind of physically-based lighting information.
}